

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hex.cpp
# Opt level: O1

string_t __thiscall
duckdb::BinaryIntegralOperator::Operation<long,duckdb::string_t>
          (BinaryIntegralOperator *this,long input,Vector *result)

{
  char cVar1;
  ulong uVar2;
  undefined1 *puVar3;
  char *pcVar4;
  long lVar5;
  bool bVar6;
  string_t target;
  undefined1 local_38 [16];
  
  if (this == (BinaryIntegralOperator *)0x0) {
    lVar5 = 0x40;
  }
  else {
    uVar2 = (ulong)this >> 1 | (ulong)this;
    uVar2 = uVar2 >> 2 | uVar2;
    uVar2 = uVar2 >> 4 | uVar2;
    uVar2 = uVar2 >> 8 | uVar2;
    uVar2 = uVar2 >> 0x10 | uVar2;
    result = (Vector *)&DAT_01f1d930;
    lVar5 = 0x3f - *(long *)(&DAT_01f1d930 +
                            ((uVar2 >> 0x20 | uVar2) * 0x3f79d71b4cb0a89 >> 0x3a) * 8);
  }
  if (lVar5 == 0x40) {
    local_38 = (undefined1  [16])
               StringVector::EmptyString
                         ((StringVector *)input,(Vector *)&DAT_00000001,(idx_t)result);
    puVar3 = local_38._8_8_;
    if (local_38._0_4_ < 0xd) {
      puVar3 = local_38 + 4;
    }
    *puVar3 = 0x30;
    uVar2 = (ulong)local_38._0_4_;
    if (0xc < uVar2) {
LAB_01c8a0b8:
      local_38._4_4_ = *(undefined4 *)local_38._8_8_;
      return (string_t)(anon_union_16_2_67f50693_for_value)local_38;
    }
    pcVar4 = local_38 + 4 + uVar2;
  }
  else {
    local_38 = (undefined1  [16])
               StringVector::EmptyString
                         ((StringVector *)input,(Vector *)(0x40 - lVar5),(idx_t)result);
    pcVar4 = local_38._8_8_;
    if (local_38._0_4_ < 0xd) {
      pcVar4 = local_38 + 4;
    }
    uVar2 = 0x3f - lVar5;
    do {
      cVar1 = NumericCastImpl<char,_unsigned_long,_false>::Convert
                        ((ulong)(((ulong)this >> (uVar2 & 0x3f) & 1) != 0) + 0x30);
      *pcVar4 = cVar1;
      pcVar4 = pcVar4 + 1;
      bVar6 = uVar2 != 0;
      uVar2 = uVar2 - 1;
    } while (bVar6);
    uVar2 = (ulong)(uint)local_38._0_4_;
    if (0xc < uVar2) goto LAB_01c8a0b8;
    pcVar4 = local_38 + 4 + uVar2;
  }
  switchD_01306cb1::default(pcVar4,0,0xc - uVar2);
  return (anon_union_16_2_67f50693_for_value)(anon_union_16_2_67f50693_for_value)local_38;
}

Assistant:

static RESULT_TYPE Operation(INPUT_TYPE input, Vector &result) {

		auto num_leading_zero = CountZeros<uint64_t>::Leading(static_cast<uint64_t>(input));
		idx_t num_bits_to_check = 64 - num_leading_zero;
		D_ASSERT(num_bits_to_check <= sizeof(INPUT_TYPE) * 8);

		idx_t buffer_size = num_bits_to_check;

		// Special case: All bits are zero
		if (buffer_size == 0) {
			auto target = StringVector::EmptyString(result, 1);
			auto output = target.GetDataWriteable();
			*output = '0';
			target.Finalize();
			return target;
		}

		D_ASSERT(buffer_size > 0);
		auto target = StringVector::EmptyString(result, buffer_size);
		auto output = target.GetDataWriteable();

		WriteBinBytes(static_cast<uint64_t>(input), output, buffer_size);

		target.Finalize();
		return target;
	}